

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O1

void helper_gvec_ssadd8_s390x(void *d,void *a,void *b,uint32_t desc)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  char cVar5;
  
  uVar3 = desc * 8 & 0xff;
  uVar4 = 0;
  do {
    cVar1 = *(char *)((long)a + uVar4);
    cVar2 = *(char *)((long)b + uVar4);
    cVar5 = ((char)(cVar1 + cVar2) >> 7) + -0x80;
    if (!SCARRY1(cVar1,cVar2)) {
      cVar5 = cVar1 + cVar2;
    }
    *(char *)((long)d + uVar4) = cVar5;
    uVar4 = uVar4 + 1;
  } while (uVar3 + 8 != uVar4);
  if (uVar3 < (desc >> 2 & 0xf8)) {
    helper_gvec_ssadd8_s390x_cold_1();
  }
  return;
}

Assistant:

void HELPER(gvec_ssadd8)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(int8_t)) {
        int r = *(int8_t *)((char *)a + i) + *(int8_t *)((char *)b + i);
        if (r > INT8_MAX) {
            r = INT8_MAX;
        } else if (r < INT8_MIN) {
            r = INT8_MIN;
        }
        *(int8_t *)((char *)d + i) = r;
    }
    clear_high(d, oprsz, desc);
}